

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

DescriptorStringView __thiscall
google::protobuf::FieldDescriptor::PrintableNameForExtension_abi_cxx11_(FieldDescriptor *this)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  
  if (((((this->field_0x1 & 8) != 0) && ((this->field_0x1 & 0xc0) == 0x40)) &&
      ((this->containing_type_->options_->field_0)._impl_.message_set_wire_format_ != false)) &&
     (this->type_ == '\v')) {
    pDVar1 = extension_scope(this);
    pDVar2 = message_type(this);
    if (pDVar1 == pDVar2) {
      this = (FieldDescriptor *)message_type(this);
    }
  }
  return ((Descriptor *)this)->all_names_ + 1;
}

Assistant:

internal::DescriptorStringView FieldDescriptor::PrintableNameForExtension()
    const {
  const bool is_message_set_extension =
      is_extension() &&
      containing_type()->options().message_set_wire_format() &&
      type() == FieldDescriptor::TYPE_MESSAGE && is_optional() &&
      extension_scope() == message_type();
  return is_message_set_extension ? message_type()->full_name() : full_name();
}